

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

Interval * __thiscall
vkt::shaderexecutor::FloatFunc2::applyPoint
          (Interval *__return_storage_ptr__,FloatFunc2 *this,EvalContext *ctx,double x,double y)

{
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  Interval local_98;
  Interval local_80;
  Interval local_68;
  Interval local_50;
  double local_38;
  double prec;
  double exact;
  double y_local;
  double x_local;
  EvalContext *ctx_local;
  FloatFunc2 *this_local;
  
  exact = y;
  y_local = x;
  x_local = (double)ctx;
  ctx_local = (EvalContext *)this;
  (*(this->
    super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    ).
    super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    .super_FuncBase._vptr_FuncBase[0xd])(x,y);
  prec = extraout_XMM0_Qa;
  (*(this->
    super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    ).
    super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    .super_FuncBase._vptr_FuncBase[0xf])(extraout_XMM0_Qa,y_local,exact,this,x_local);
  local_38 = extraout_XMM0_Qa_00;
  tcu::Interval::Interval(&local_50,prec);
  tcu::Interval::Interval(&local_80,-local_38);
  tcu::Interval::Interval(&local_98,local_38);
  tcu::Interval::Interval(&local_68,&local_80,&local_98);
  tcu::operator+(__return_storage_ptr__,&local_50,&local_68);
  return __return_storage_ptr__;
}

Assistant:

virtual Interval	applyPoint		(const EvalContext&	ctx,
										 double				x,
										 double				y) const
	{
		const double exact	= this->applyExact(x, y);
		const double prec	= this->precision(ctx, exact, x, y);

		return exact + Interval(-prec, prec);
	}